

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::earcutLinked(Earcut<unsigned_int> *this,Node *ear,int pass)

{
  bool bVar1;
  Earcut<unsigned_int> *pEVar2;
  int in_EDX;
  Earcut<unsigned_int> *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  int iterations;
  Node *next;
  Node *prev;
  Node *stop;
  undefined4 in_stack_00000030;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  Earcut<unsigned_int> *in_stack_ffffffffffffffd0;
  Earcut<unsigned_int> *this_00;
  Node *start;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RSI != (Earcut<unsigned_int> *)0x0) {
    if ((in_EDX == 0) && ((in_RDI->hashing & 1U) != 0)) {
      indexCurve(in_stack_ffffffffffffffd0,
                 (Node *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    iVar3 = 0;
    pEVar2 = in_RSI;
    do {
      while( true ) {
        if ((Node *)pEVar2->vertices == *(Node **)&pEVar2->hashing) {
          return;
        }
        iVar3 = iVar3 + 1;
        start = (Node *)pEVar2->vertices;
        this_00 = *(Earcut<unsigned_int> **)&pEVar2->hashing;
        if ((in_RDI->hashing & 1U) == 0) break;
        bVar1 = isEarHashed((Earcut<unsigned_int> *)ear,(Node *)CONCAT44(pass,in_stack_00000030));
        if (!bVar1) goto LAB_0019969d;
LAB_00199640:
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  (&this_00->indices,(uint *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  (&this_00->indices,(uint *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  (&this_00->indices,(uint *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
        removeNode(in_RDI,(Node *)pEVar2);
        in_RSI = *(Earcut<unsigned_int> **)&this_00->hashing;
        pEVar2 = *(Earcut<unsigned_int> **)&this_00->hashing;
      }
      bVar1 = isEar((Earcut<unsigned_int> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    (Node *)in_RSI);
      if (bVar1) goto LAB_00199640;
LAB_0019969d:
      pEVar2 = this_00;
    } while (this_00 != in_RSI);
    if (in_EDX == 0) {
      filterPoints(in_RSI,start,(Node *)this_00);
      earcutLinked(this_00,(Node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   (int)((ulong)in_RSI >> 0x20));
    }
    else if (in_EDX == 1) {
      filterPoints(in_RSI,start,(Node *)this_00);
      pEVar2 = (Earcut<unsigned_int> *)cureLocalIntersections(in_RSI,start);
      earcutLinked(pEVar2,(Node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   (int)((ulong)in_RSI >> 0x20));
    }
    else if (in_EDX == 2) {
      splitEarcut(in_RSI,start);
    }
  }
  return;
}

Assistant:

void Earcut<N>::earcutLinked(Node* ear, int pass) {
    if (!ear) return;

    // interlink polygon nodes in z-order
    if (!pass && hashing) indexCurve(ear);

    Node* stop = ear;
    Node* prev;
    Node* next;

    int iterations = 0;

    // iterate through ears, slicing them one by one
    while (ear->prev != ear->next) {
        iterations++;
        prev = ear->prev;
        next = ear->next;

        if (hashing ? isEarHashed(ear) : isEar(ear)) {
            // cut off the triangle
            indices.emplace_back(prev->i);
            indices.emplace_back(ear->i);
            indices.emplace_back(next->i);

            removeNode(ear);

            // skipping the next vertice leads to less sliver triangles
            ear = next->next;
            stop = next->next;

            continue;
        }

        ear = next;

        // if we looped through the whole remaining polygon and can't find any more ears
        if (ear == stop) {
            // try filtering points and slicing again
            if (!pass) earcutLinked(filterPoints(ear), 1);

            // if this didn't work, try curing all small self-intersections locally
            else if (pass == 1) {
                ear = cureLocalIntersections(filterPoints(ear));
                earcutLinked(ear, 2);

            // as a last resort, try splitting the remaining polygon into two
            } else if (pass == 2) splitEarcut(ear);

            break;
        }
    }
}